

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O2

Memory * wasm::
         addModuleElement<std::vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>,std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>,wasm::Memory>
                   (vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    *v,unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
                       *m,unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr,
                   string *funcName)

{
  ostream *poVar1;
  Memory *pMVar2;
  char *pcVar3;
  mapped_type __k;
  mapped_type pMVar4;
  mapped_type *ppMVar5;
  Fatal *this;
  Name name;
  undefined1 local_1b0 [392];
  
  pMVar2 = (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
           .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  pcVar3 = *(char **)((long)&(pMVar2->super_Importable).super_Named + 8);
  if (pcVar3 == (char *)0x0) {
    Fatal::Fatal((Fatal *)local_1b0);
    std::operator<<((ostream *)(local_1b0 + 0x10),"Module::");
    std::operator<<((ostream *)(local_1b0 + 0x10),(string *)funcName);
    Fatal::operator<<((Fatal *)local_1b0,(char (*) [13])": empty name");
  }
  else {
    name.super_IString.str._M_str = (char *)funcName;
    name.super_IString.str._M_len = (size_t)pcVar3;
    pMVar4 = getModuleElementOrNull<std::unordered_map<wasm::Name,wasm::Memory*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Memory*>>>>
                       ((wasm *)m,
                        *(unordered_map<wasm::Name,_wasm::Memory_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>_>
                          **)&(pMVar2->super_Importable).super_Named,name);
    if (pMVar4 == (mapped_type)0x0) {
      __k = (curr->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
            super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
      ppMVar5 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Memory_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Memory_*>,_std::allocator<std::pair<const_wasm::Name,_wasm::Memory_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)m,(key_type *)__k);
      *ppMVar5 = __k;
      std::
      vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>
      ::emplace_back<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>
                ((vector<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>,std::allocator<std::unique_ptr<wasm::Memory,std::default_delete<wasm::Memory>>>>
                  *)v,curr);
      return __k;
    }
    Fatal::Fatal((Fatal *)local_1b0);
    poVar1 = (ostream *)(local_1b0 + 0x10);
    std::operator<<(poVar1,"Module::");
    std::operator<<(poVar1,(string *)funcName);
    std::operator<<(poVar1,": ");
    this = Fatal::operator<<((Fatal *)local_1b0,
                             (Name *)(curr->_M_t).
                                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                     .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    Fatal::operator<<(this,(char (*) [16])" already exists");
  }
  Fatal::~Fatal((Fatal *)local_1b0);
}

Assistant:

Elem* addModuleElement(Vector& v,
                       Map& m,
                       std::unique_ptr<Elem> curr,
                       std::string funcName) {
  if (!curr->name.is()) {
    Fatal() << "Module::" << funcName << ": empty name";
  }
  if (getModuleElementOrNull(m, curr->name)) {
    Fatal() << "Module::" << funcName << ": " << curr->name
            << " already exists";
  }
  auto* ret = m[curr->name] = curr.get();
  v.push_back(std::move(curr));
  return ret;
}